

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O0

void SaveBytes(uchar *data16,AES_state *s)

{
  byte local_25;
  int local_24;
  int iStack_20;
  uint8_t v;
  int b;
  int r;
  int c;
  AES_state *s_local;
  uchar *data16_local;
  
  s_local = (AES_state *)data16;
  for (b = 0; b < 4; b = b + 1) {
    for (iStack_20 = 0; iStack_20 < 4; iStack_20 = iStack_20 + 1) {
      local_25 = 0;
      for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
        local_25 = local_25 |
                   (byte)(((int)(uint)s->slice[local_24] >>
                           ((char)(iStack_20 << 2) + (char)b & 0x1fU) & 1U) <<
                         ((byte)local_24 & 0x1f));
      }
      *(byte *)s_local->slice = local_25;
      s_local = (AES_state *)((long)s_local->slice + 1);
    }
  }
  return;
}

Assistant:

static void SaveBytes(unsigned char* data16, const AES_state *s) {
    int c;
    for (c = 0; c < 4; c++) {
        int r;
        for (r = 0; r < 4; r++) {
            int b;
            uint8_t v = 0;
            for (b = 0; b < 8; b++) {
                v |= ((s->slice[b] >> (r * 4 + c)) & 1) << b;
            }
            *(data16++) = v;
        }
    }
}